

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void trace_start(jit_State *J)

{
  TValue *pTVar1;
  VMEvent ev;
  GCstr *pGVar2;
  void *in_RDI;
  ptrdiff_t argbase;
  TraceNo traceno;
  lua_State *L;
  jit_State *in_stack_ffffffffffffff18;
  TValue *argbase_00;
  jit_State *in_stack_ffffffffffffff30;
  lua_State *in_stack_ffffffffffffff40;
  lua_State *L_00;
  char *in_stack_ffffffffffffff50;
  lua_State *in_stack_ffffffffffffff58;
  
  if ((*(byte *)(*(long *)((long)in_RDI + 0x78) + 0x25) & 8) == 0) {
    ev = trace_findfree(in_stack_ffffffffffffff18);
    if (ev == LJ_VMEVENT_BC_) {
      lj_trace_flushall(in_stack_ffffffffffffff40);
      *(undefined4 *)((long)in_RDI + 0xbc) = 0;
    }
    else {
      *(int *)(*(long *)((long)in_RDI + 0x130) + (ulong)ev * 4) = (int)in_RDI;
      memset(in_RDI,0,0x60);
      *(short *)((long)in_RDI + 0x50) = (short)ev;
      *(undefined4 *)((long)in_RDI + 0x18) = 0x8000;
      *(undefined4 *)((long)in_RDI + 8) = 0x8000;
      *(undefined8 *)((long)in_RDI + 0x10) = *(undefined8 *)((long)in_RDI + 0x100);
      *(undefined8 *)((long)in_RDI + 0x20) = *(undefined8 *)((long)in_RDI + 0x118);
      *(undefined8 *)((long)in_RDI + 0x28) = *(undefined8 *)((long)in_RDI + 0x120);
      *(undefined1 *)((long)in_RDI + 0x94) = 0;
      *(undefined1 *)((long)in_RDI + 0x95) = 0;
      *(undefined1 *)((long)in_RDI + 0x97) = 0;
      *(undefined1 *)((long)in_RDI + 0x96) = 0;
      *(undefined4 *)((long)in_RDI + 300) = 0;
      *(int *)((long)in_RDI + 0x30) = (int)*(undefined8 *)((long)in_RDI + 0x78);
      L_00 = *(lua_State **)((long)in_RDI + 0x60);
      if (((*(byte *)((ulong)(L_00->glref).ptr32 + 0x93) & 2) != 0) &&
         (in_stack_ffffffffffffff30 = (jit_State *)lj_vmevent_prepare(L_00,ev),
         in_stack_ffffffffffffff30 != (jit_State *)0x0)) {
        argbase_00 = L_00->top;
        L_00->top = argbase_00 + 1;
        pGVar2 = lj_str_new(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(size_t)in_RDI);
        (argbase_00->u32).lo = (uint32_t)pGVar2;
        (argbase_00->field_2).it = 0xfffffffb;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pTVar1->n = (double)(int)ev;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        (pTVar1->u32).lo = (uint32_t)*(undefined8 *)((long)in_RDI + 0x70);
        (pTVar1->field_2).it = 0xfffffff7;
        pTVar1 = L_00->top;
        L_00->top = pTVar1 + 1;
        pTVar1->n = (double)(int)(*(long *)((long)in_RDI + 0x68) -
                                  (*(long *)((long)in_RDI + 0x78) + 0x40) >> 2);
        if (*(int *)((long)in_RDI + 0x958) != 0) {
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pTVar1->n = (double)*(int *)((long)in_RDI + 0x958);
          pTVar1 = L_00->top;
          L_00->top = pTVar1 + 1;
          pTVar1->n = (double)*(int *)((long)in_RDI + 0x95c);
        }
        lj_vmevent_call((lua_State *)in_stack_ffffffffffffff30,(ptrdiff_t)argbase_00);
      }
      lj_record_setup(in_stack_ffffffffffffff30);
    }
  }
  else {
    if (*(int *)((long)in_RDI + 0x958) == 0) {
      **(char **)((long)in_RDI + 0x68) = (char)**(undefined4 **)((long)in_RDI + 0x68) + '\x01';
      *(byte *)(*(long *)((long)in_RDI + 0x78) + 0x25) =
           *(byte *)(*(long *)((long)in_RDI + 0x78) + 0x25) | 0x10;
    }
    *(undefined4 *)((long)in_RDI + 0xbc) = 0;
  }
  return;
}

Assistant:

static void trace_start(jit_State *J)
{
  lua_State *L;
  TraceNo traceno;

  if ((J->pt->flags & PROTO_NOJIT)) {  /* JIT disabled for this proto? */
    if (J->parent == 0) {
      /* Lazy bytecode patching to disable hotcount events. */
      lua_assert(bc_op(*J->pc) == BC_FORL || bc_op(*J->pc) == BC_ITERL ||
		 bc_op(*J->pc) == BC_LOOP || bc_op(*J->pc) == BC_FUNCF);
      setbc_op(J->pc, (int)bc_op(*J->pc)+(int)BC_ILOOP-(int)BC_LOOP);
      J->pt->flags |= PROTO_ILOOP;
    }
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }

  /* Get a new trace number. */
  traceno = trace_findfree(J);
  if (LJ_UNLIKELY(traceno == 0)) {  /* No free trace? */
    lua_assert((J2G(J)->hookmask & HOOK_GC) == 0);
    lj_trace_flushall(J->L);
    J->state = LJ_TRACE_IDLE;  /* Silently ignored. */
    return;
  }
  setgcrefp(J->trace[traceno], &J->cur);

  /* Setup enough of the current trace to be able to send the vmevent. */
  memset(&J->cur, 0, sizeof(GCtrace));
  J->cur.traceno = traceno;
  J->cur.nins = J->cur.nk = REF_BASE;
  J->cur.ir = J->irbuf;
  J->cur.snap = J->snapbuf;
  J->cur.snapmap = J->snapmapbuf;
  J->mergesnap = 0;
  J->needsnap = 0;
  J->bcskip = 0;
  J->guardemit.irt = 0;
  J->postproc = LJ_POST_NONE;
  lj_resetsplit(J);
  setgcref(J->cur.startpt, obj2gco(J->pt));

  L = J->L;
  lj_vmevent_send(L, TRACE,
    setstrV(L, L->top++, lj_str_newlit(L, "start"));
    setintV(L->top++, traceno);
    setfuncV(L, L->top++, J->fn);
    setintV(L->top++, proto_bcpos(J->pt, J->pc));
    if (J->parent) {
      setintV(L->top++, J->parent);
      setintV(L->top++, J->exitno);
    }
  );
  lj_record_setup(J);
}